

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

RESET_DATA * new_reset_data(void)

{
  RESET_DATA *pRVar1;
  
  if (reset_free == (RESET_DATA *)0x0) {
    pRVar1 = (RESET_DATA *)operator_new(0x18);
    pRVar1->next = (RESET_DATA *)0x0;
    pRVar1->command = '\0';
    pRVar1->field_0x9 = 0;
    pRVar1->arg1 = 0;
    pRVar1->arg2 = 0;
    pRVar1->arg3 = 0;
    *(undefined8 *)&pRVar1->arg4 = 0;
    top_reset = top_reset + 1;
  }
  else {
    pRVar1 = reset_free;
    reset_free = reset_free->next;
  }
  pRVar1->next = (RESET_DATA *)0x0;
  pRVar1->command = 'X';
  pRVar1->arg1 = 0;
  pRVar1->arg2 = 0;
  pRVar1->arg3 = 0;
  return pRVar1;
}

Assistant:

RESET_DATA *new_reset_data(void)
{
	RESET_DATA *pReset;

	if (!reset_free)
	{
		pReset = new RESET_DATA;
		CLEAR_MEM(pReset, sizeof(RESET_DATA))
		top_reset++;
	}
	else
	{
		pReset = reset_free;
		reset_free = reset_free->next;
	}

	pReset->next = nullptr;
	pReset->command = 'X';
	pReset->arg1 = 0;
	pReset->arg2 = 0;
	pReset->arg3 = 0;

	return pReset;
}